

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall efsw::String::String(String *this,char *uf8String)

{
  size_t sVar1;
  back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  output;
  size_t length;
  char *uf8String_local;
  String *this_local;
  
  std::__cxx11::u32string::u32string((u32string *)this);
  if ((uf8String != (char *)0x0) && (sVar1 = strlen(uf8String), sVar1 != 0)) {
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    reserve(&this->mString,sVar1 + 1);
    output = std::back_inserter<std::__cxx11::u32string>(&this->mString);
    Utf<8u>::ToUtf32<char_const*,std::back_insert_iterator<std::__cxx11::u32string>>
              (uf8String,uf8String + sVar1,output);
  }
  return;
}

Assistant:

String::String( const char* uf8String ) {
	if ( uf8String ) {
		std::size_t length = strlen( uf8String );

		if ( length > 0 ) {
			mString.reserve( length + 1 );

			Utf8::ToUtf32( uf8String, uf8String + length, std::back_inserter( mString ) );
		}
	}
}